

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O3

SNMP_PACKET_PARSE_ERROR __thiscall SNMPPacket::parseFrom(SNMPPacket *this,uchar *buf,size_t max_len)

{
  int iVar1;
  SNMP_PACKET_PARSE_ERROR SVar2;
  ComplexType *this_00;
  
  iVar1 = -0x16;
  if (*buf == '0') {
    this_00 = (ComplexType *)operator_new(0x28);
    (this_00->super_BER_CONTAINER)._type = STRUCTURE;
    (this_00->super_BER_CONTAINER)._length = 0;
    (this_00->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__ComplexType_001a1058;
    (this_00->values).
    super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->values).
    super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->values).
    super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->packet = this_00;
    iVar1 = ComplexType::fromBuffer(this_00,buf,max_len);
    if (0 < iVar1) {
      SVar2 = parsePacket(this,this->packet,SNMPVERSION);
      return SVar2;
    }
  }
  return iVar1;
}

Assistant:

SNMP_PACKET_PARSE_ERROR SNMPPacket::parseFrom(unsigned char* buf, size_t max_len){
    SNMP_LOGD("Parsing %ld bytes\n", max_len);
    if(buf[0] != 0x30) {
        SNMP_LOGD("First byte error\n");
        return SNMP_PARSE_ERROR_MAGIC_BYTE;
    }

    packet = new ComplexType(STRUCTURE);

    SNMP_BUFFER_PARSE_ERROR decodePacket = packet->fromBuffer(buf, max_len);
    if(decodePacket <= 0){
        SNMP_LOGD("failed to fromBuffer\n");
        return decodePacket;
    }

    // we now have a full ASN.1 packet in SNMPPacket
    return parsePacket(packet, SNMPVERSION);
}